

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  __m128i *palVar7;
  __m128i *palVar8;
  __m128i *palVar9;
  __m128i *palVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  parasail_result_t *ppVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  longlong lVar16;
  ulong uVar17;
  ulong uVar18;
  longlong lVar19;
  longlong lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i alVar51;
  short sVar52;
  short sVar53;
  int iVar54;
  int iVar55;
  __m128i *ptr;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int16_t *ptr_00;
  __m128i *palVar56;
  uint uVar57;
  int iVar58;
  int iVar59;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ushort uVar60;
  short sVar61;
  short sVar62;
  short sVar66;
  short sVar67;
  short sVar69;
  short sVar70;
  ushort uVar71;
  short sVar72;
  short sVar73;
  ulong uVar63;
  ushort uVar65;
  ushort uVar68;
  ushort uVar74;
  short sVar75;
  short sVar76;
  ushort uVar78;
  ushort uVar81;
  undefined1 auVar64 [16];
  short sVar79;
  short sVar80;
  short sVar82;
  short sVar83;
  ushort uVar84;
  short sVar85;
  short sVar86;
  ulong uVar77;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  __m128i alVar94;
  __m128i alVar95;
  __m128i alVar96;
  __m128i alVar97;
  __m128i alVar98;
  __m128i alVar99;
  ulong local_1078;
  long local_1068;
  long local_1060;
  ulong uStack_1048;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  int16_t tmp2;
  int64_t tmp_6;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t e;
  __m128i_16_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_dd0;
  short local_dce;
  short local_dcc;
  short local_dca;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  __m128i vOne;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_cd0;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  short local_818;
  short sStack_816;
  short sStack_814;
  short sStack_812;
  short sStack_810;
  short sStack_80e;
  short sStack_80c;
  short sStack_80a;
  ushort local_808;
  ushort uStack_806;
  ushort uStack_804;
  ushort uStack_802;
  ushort uStack_800;
  ushort uStack_7fe;
  ushort uStack_7fc;
  ushort uStack_7fa;
  short local_7f8;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7f0;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  short local_7b8;
  short sStack_7b6;
  short sStack_7b4;
  short sStack_7b2;
  short sStack_7b0;
  short sStack_7ae;
  short sStack_7ac;
  short sStack_7aa;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short sStack_7a0;
  short sStack_79e;
  short sStack_79c;
  short sStack_79a;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  short local_768;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_760;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_730;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  ushort local_728;
  ushort uStack_726;
  ushort uStack_724;
  ushort uStack_722;
  ushort uStack_720;
  ushort uStack_71e;
  ushort uStack_71c;
  ushort uStack_71a;
  short local_708;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  short sStack_700;
  short sStack_6fe;
  short sStack_6fc;
  short sStack_6fa;
  ushort local_6f8;
  ushort uStack_6f6;
  ushort uStack_6f4;
  ushort uStack_6f2;
  ushort uStack_6f0;
  ushort uStack_6ee;
  ushort uStack_6ec;
  ushort uStack_6ea;
  ushort local_6a8;
  ushort uStack_6a6;
  ushort uStack_6a4;
  ushort uStack_6a2;
  ushort uStack_6a0;
  ushort uStack_69e;
  ushort uStack_69c;
  ushort uStack_69a;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  ulong uStack_f0;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  size_t len;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_striped_profile_sse41_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_striped_profile_sse41_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_striped_profile_sse41_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_striped_profile_sse41_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_striped_profile_sse41_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_striped_profile_sse41_128_16","s2Len")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_striped_profile_sse41_128_16","open")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_striped_profile_sse41_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_cd0 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar54 = (iVar1 + 7) / 8;
    iVar59 = (iVar1 + -1) % iVar54;
    pvVar4 = (profile->profile16).score;
    pvVar5 = (profile->profile16).matches;
    pvVar6 = (profile->profile16).similar;
    i._0_2_ = (short)open;
    uVar11 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar14 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (undefined2)gap;
    uVar12 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    uVar15 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    if (ppVar3->min <= -open) {
      i._0_2_ = -(short)ppVar3->min;
    }
    sVar52 = (short)i + -0x7fff;
    sVar53 = ((ushort)ppVar3->max ^ 0x7fff) - 1;
    ppVar13 = (parasail_result_t *)CONCAT26(sVar52,CONCAT24(sVar52,CONCAT22(sVar52,sVar52)));
    lVar16 = CONCAT26(sVar52,CONCAT24(sVar52,CONCAT22(sVar52,sVar52)));
    vSaturationCheckMax[1] = CONCAT26(sVar53,CONCAT24(sVar53,CONCAT22(sVar53,sVar53)));
    vSaturationCheckMin[0] = CONCAT26(sVar53,CONCAT24(sVar53,CONCAT22(sVar53,sVar53)));
    result = ppVar13;
    vSaturationCheckMax[0] = lVar16;
    _segNum = (parasail_profile_t *)parasail_result_new_stats();
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      uVar57 = *(uint *)&_segNum->field_0xc | 0x8210801;
      len = (size_t)uVar57;
      *(uint *)&_segNum->field_0xc = uVar57;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar54);
      pvHMStore = parasail_memalign___m128i(0x10,(long)iVar54);
      pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar54);
      pvHSStore = parasail_memalign___m128i(0x10,(long)iVar54);
      pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar54);
      pvHLStore = parasail_memalign___m128i(0x10,(long)iVar54);
      pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar54);
      pvE = parasail_memalign___m128i(0x10,(long)iVar54);
      ptr = parasail_memalign___m128i(0x10,(long)iVar54);
      b = parasail_memalign___m128i(0x10,(long)iVar54);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar54);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar54);
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar94[0] = (long)iVar54;
        alVar94[1] = extraout_RDX;
        parasail_memset___m128i(pvHMLoad,alVar94,len);
        alVar95[0] = (long)iVar54;
        alVar95[1] = extraout_RDX_00;
        parasail_memset___m128i(pvHSLoad,alVar95,len);
        alVar96[0] = (long)iVar54;
        alVar96[1] = extraout_RDX_01;
        parasail_memset___m128i(pvHLLoad,alVar96,len);
        alVar97[0] = (long)iVar54;
        alVar97[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar97,len);
        alVar98[0] = (long)iVar54;
        alVar98[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar98,len);
        alVar99[0] = (long)iVar54;
        alVar99[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,alVar99,len);
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar54; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 8; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            local_1068 = (long)(-(gap * (h.m[1]._0_4_ * iVar54 + k)) - open);
            local_1060 = local_1068;
            if (local_1068 < -0x8000) {
              local_1060 = -0x8000;
            }
            *(short *)((long)&e + (long)(int)h.m[1]._0_4_ * 2 + 8) = (short)local_1060;
            local_1068 = local_1068 - open;
            if (local_1068 < -0x8000) {
              local_1068 = -0x8000;
            }
            *(short *)((long)&tmp + (long)(int)h.m[1]._0_4_ * 2) = (short)local_1068;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar55 = -(gap * (k + -1)) - open;
          if (iVar55 < -0x8000) {
            iVar55 = -0x8000;
          }
          ptr_00[k] = (int16_t)iVar55;
        }
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          stack0xfffffffffffff118 = ZEXT816(0);
          stack0xfffffffffffff108 = ZEXT816(0);
          vFL[0] = 0x1000100010001;
          vH[1] = 0x1000100010001;
          uVar63 = pvHLoad[iVar54 + -1][0];
          uVar77 = pvHMLoad[iVar54 + -1][0];
          uVar17 = pvHSLoad[iVar54 + -1][0];
          uVar18 = pvHLLoad[iVar54 + -1][0];
          vH[0] = pvHLoad[iVar54 + -1][1] << 0x10 | uVar63 >> 0x30;
          vHM[0] = pvHMLoad[iVar54 + -1][1] << 0x10 | uVar77 >> 0x30;
          vHS[1] = uVar77 << 0x10;
          vHS[0] = pvHSLoad[iVar54 + -1][1] << 0x10 | uVar17 >> 0x30;
          vHL[1] = uVar17 << 0x10;
          vHL[0] = pvHLLoad[iVar54 + -1][1] << 0x10 | uVar18 >> 0x30;
          vP = (__m128i *)(uVar18 << 0x10);
          vH_dag[1] = uVar63 << 0x10 | (ulong)(ushort)ptr_00[s1Len];
          iVar58 = ppVar3->mapper[(byte)s2[s1Len]] * iVar54;
          iVar55 = ppVar3->mapper[(byte)s2[s1Len]];
          iVar2 = ppVar3->mapper[(byte)s2[s1Len]];
          palVar7 = pvHMStore;
          palVar8 = pvHSStore;
          palVar9 = pvHLStore;
          palVar10 = pvE;
          vF_ext[1] = (longlong)ppVar13;
          vF[0] = lVar16;
          for (k = 0; k < iVar54; k = k + 1) {
            palVar56 = ptr + k;
            lVar19 = (*palVar56)[0];
            lVar20 = (*palVar56)[1];
            alVar94 = *palVar56;
            alVar98 = b[k];
            alVar95 = b[k];
            alVar99 = b_00[k];
            alVar96 = b_00[k];
            alVar51 = b_01[k];
            alVar97 = b_01[k];
            auVar87._8_8_ = vH[0];
            auVar87._0_8_ = vH_dag[1];
            auVar64 = paddsw(auVar87,*(undefined1 (*) [16])
                                      ((long)pvVar4 + (long)k * 0x10 + (long)iVar58 * 0x10));
            local_6f8 = auVar64._0_2_;
            uStack_6f6 = auVar64._2_2_;
            uStack_6f4 = auVar64._4_2_;
            uStack_6f2 = auVar64._6_2_;
            uStack_6f0 = auVar64._8_2_;
            uStack_6ee = auVar64._10_2_;
            uStack_6ec = auVar64._12_2_;
            uStack_6ea = auVar64._14_2_;
            local_708 = (short)lVar19;
            sStack_706 = (short)((ulong)lVar19 >> 0x10);
            sStack_704 = (short)((ulong)lVar19 >> 0x20);
            sStack_702 = (short)((ulong)lVar19 >> 0x30);
            sStack_700 = (short)lVar20;
            sStack_6fe = (short)((ulong)lVar20 >> 0x10);
            sStack_6fc = (short)((ulong)lVar20 >> 0x20);
            sStack_6fa = (short)((ulong)lVar20 >> 0x30);
            uVar60 = (ushort)((short)local_6f8 < local_708) * local_708 |
                     ((short)local_6f8 >= local_708) * local_6f8;
            uVar65 = (ushort)((short)uStack_6f6 < sStack_706) * sStack_706 |
                     ((short)uStack_6f6 >= sStack_706) * uStack_6f6;
            uVar68 = (ushort)((short)uStack_6f4 < sStack_704) * sStack_704 |
                     ((short)uStack_6f4 >= sStack_704) * uStack_6f4;
            uVar71 = (ushort)((short)uStack_6f2 < sStack_702) * sStack_702 |
                     ((short)uStack_6f2 >= sStack_702) * uStack_6f2;
            uVar74 = (ushort)((short)uStack_6f0 < sStack_700) * sStack_700 |
                     ((short)uStack_6f0 >= sStack_700) * uStack_6f0;
            uVar78 = (ushort)((short)uStack_6ee < sStack_6fe) * sStack_6fe |
                     ((short)uStack_6ee >= sStack_6fe) * uStack_6ee;
            uVar81 = (ushort)((short)uStack_6ec < sStack_6fc) * sStack_6fc |
                     ((short)uStack_6ec >= sStack_6fc) * uStack_6ec;
            uVar84 = (ushort)((short)uStack_6ea < sStack_6fa) * sStack_6fa |
                     ((short)uStack_6ea >= sStack_6fa) * uStack_6ea;
            local_728 = (ushort)vF_ext[1];
            uStack_726 = (ushort)((ulong)vF_ext[1] >> 0x10);
            uStack_724 = (ushort)((ulong)vF_ext[1] >> 0x20);
            uStack_722 = (ushort)((ulong)vF_ext[1] >> 0x30);
            uStack_720 = (ushort)vF[0];
            uStack_71e = (ushort)((ulong)vF[0] >> 0x10);
            uStack_71c = (ushort)((ulong)vF[0] >> 0x20);
            uStack_71a = (ushort)((ulong)vF[0] >> 0x30);
            uVar60 = ((short)uVar60 < (short)local_728) * local_728 |
                     ((short)uVar60 >= (short)local_728) * uVar60;
            uVar65 = ((short)uVar65 < (short)uStack_726) * uStack_726 |
                     ((short)uVar65 >= (short)uStack_726) * uVar65;
            uVar68 = ((short)uVar68 < (short)uStack_724) * uStack_724 |
                     ((short)uVar68 >= (short)uStack_724) * uVar68;
            uVar71 = ((short)uVar71 < (short)uStack_722) * uStack_722 |
                     ((short)uVar71 >= (short)uStack_722) * uVar71;
            uVar74 = ((short)uVar74 < (short)uStack_720) * uStack_720 |
                     ((short)uVar74 >= (short)uStack_720) * uVar74;
            uVar78 = ((short)uVar78 < (short)uStack_71e) * uStack_71e |
                     ((short)uVar78 >= (short)uStack_71e) * uVar78;
            uVar81 = ((short)uVar81 < (short)uStack_71c) * uStack_71c |
                     ((short)uVar81 >= (short)uStack_71c) * uVar81;
            uVar84 = ((short)uVar84 < (short)uStack_71a) * uStack_71a |
                     ((short)uVar84 >= (short)uStack_71a) * uVar84;
            vH_dag[1]._0_4_ = CONCAT22(uVar65,uVar60);
            vH_dag[1]._0_6_ = CONCAT24(uVar68,(undefined4)vH_dag[1]);
            vH_dag[1] = CONCAT26(uVar71,(undefined6)vH_dag[1]);
            vH[0]._0_4_ = CONCAT22(uVar78,uVar74);
            vH[0]._0_6_ = CONCAT24(uVar81,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar84,(undefined6)vH[0]);
            pvHMStore[k][0] = vH_dag[1];
            pvHMStore[k][1] = vH[0];
            sVar61 = -(ushort)(uVar60 == local_6f8);
            sVar66 = -(ushort)(uVar65 == uStack_6f6);
            sVar69 = -(ushort)(uVar68 == uStack_6f4);
            sVar72 = -(ushort)(uVar71 == uStack_6f2);
            sVar75 = -(ushort)(uVar74 == uStack_6f0);
            sVar79 = -(ushort)(uVar78 == uStack_6ee);
            sVar82 = -(ushort)(uVar81 == uStack_6ec);
            sVar85 = -(ushort)(uVar84 == uStack_6ea);
            sVar62 = -(ushort)(uVar60 == local_728);
            sVar67 = -(ushort)(uVar65 == uStack_726);
            sVar70 = -(ushort)(uVar68 == uStack_724);
            sVar73 = -(ushort)(uVar71 == uStack_722);
            sVar76 = -(ushort)(uVar74 == uStack_720);
            sVar80 = -(ushort)(uVar78 == uStack_71e);
            sVar83 = -(ushort)(uVar81 == uStack_71c);
            sVar86 = -(ushort)(uVar84 == uStack_71a);
            auVar39._2_2_ = sVar67;
            auVar39._0_2_ = sVar62;
            auVar39._4_2_ = sVar70;
            auVar39._6_2_ = sVar73;
            auVar39._10_2_ = sVar80;
            auVar39._8_2_ = sVar76;
            auVar39._12_2_ = sVar83;
            auVar39._14_2_ = sVar86;
            auVar92 = pblendvb((undefined1  [16])alVar98,stack0xfffffffffffff118,auVar39);
            auVar64 = paddsw((undefined1  [16])stack0xfffffffffffff0c8,
                             *(undefined1 (*) [16])
                              ((long)pvVar5 + (long)k * 0x10 + (long)(iVar55 * iVar54) * 0x10));
            auVar38._2_2_ = sVar66;
            auVar38._0_2_ = sVar61;
            auVar38._4_2_ = sVar69;
            auVar38._6_2_ = sVar72;
            auVar38._10_2_ = sVar79;
            auVar38._8_2_ = sVar75;
            auVar38._12_2_ = sVar82;
            auVar38._14_2_ = sVar85;
            auVar87 = pblendvb(auVar92,auVar64,auVar38);
            vHS[1] = auVar87._0_8_;
            vHM[0] = auVar87._8_8_;
            pvHSStore[k][0] = vHS[1];
            pvHSStore[k][1] = vHM[0];
            auVar37._2_2_ = sVar67;
            auVar37._0_2_ = sVar62;
            auVar37._4_2_ = sVar70;
            auVar37._6_2_ = sVar73;
            auVar37._10_2_ = sVar80;
            auVar37._8_2_ = sVar76;
            auVar37._12_2_ = sVar83;
            auVar37._14_2_ = sVar86;
            auVar92 = pblendvb((undefined1  [16])alVar99,stack0xfffffffffffff108,auVar37);
            auVar64 = paddsw((undefined1  [16])stack0xfffffffffffff0b8,
                             *(undefined1 (*) [16])
                              ((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar54) * 0x10));
            auVar36._2_2_ = sVar66;
            auVar36._0_2_ = sVar61;
            auVar36._4_2_ = sVar69;
            auVar36._6_2_ = sVar72;
            auVar36._10_2_ = sVar79;
            auVar36._8_2_ = sVar75;
            auVar36._12_2_ = sVar82;
            auVar36._14_2_ = sVar85;
            auVar88 = pblendvb(auVar92,auVar64,auVar36);
            vHL[1] = auVar88._0_8_;
            vHS[0] = auVar88._8_8_;
            pvHLStore[k][0] = vHL[1];
            pvHLStore[k][1] = vHS[0];
            auVar35._2_2_ = sVar67;
            auVar35._0_2_ = sVar62;
            auVar35._4_2_ = sVar70;
            auVar35._6_2_ = sVar73;
            auVar35._10_2_ = sVar80;
            auVar35._8_2_ = sVar76;
            auVar35._12_2_ = sVar83;
            auVar35._14_2_ = sVar86;
            auVar92 = pblendvb((undefined1  [16])alVar51,stack0xfffffffffffff0f8,auVar35);
            auVar89._8_8_ = 0x1000100010001;
            auVar89._0_8_ = 0x1000100010001;
            auVar64 = paddsw((undefined1  [16])_vP,auVar89);
            auVar34._2_2_ = sVar66;
            auVar34._0_2_ = sVar61;
            auVar34._4_2_ = sVar69;
            auVar34._6_2_ = sVar72;
            auVar34._10_2_ = sVar79;
            auVar34._8_2_ = sVar75;
            auVar34._12_2_ = sVar82;
            auVar34._14_2_ = sVar85;
            auVar89 = pblendvb(auVar92,auVar64,auVar34);
            vP = auVar89._0_8_;
            vHL[0] = auVar89._8_8_;
            pvE[k][0] = (longlong)vP;
            pvE[k][1] = vHL[0];
            local_2b8 = (short)vSaturationCheckMax[1];
            sStack_2b6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_2b4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_2b2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_2b0 = (short)vSaturationCheckMin[0];
            sStack_2ae = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_2ac = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_2aa = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT22(((short)uVar65 < sStack_2b6) * uVar65 |
                          (ushort)((short)uVar65 >= sStack_2b6) * sStack_2b6,
                          ((short)uVar60 < local_2b8) * uVar60 |
                          (ushort)((short)uVar60 >= local_2b8) * local_2b8);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT24(((short)uVar68 < sStack_2b4) * uVar68 |
                          (ushort)((short)uVar68 >= sStack_2b4) * sStack_2b4,
                          (undefined4)vSaturationCheckMax[1]);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uVar71 < sStack_2b2) * uVar71 |
                          (ushort)((short)uVar71 >= sStack_2b2) * sStack_2b2,
                          (undefined6)vSaturationCheckMax[1]);
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT22(((short)uVar78 < sStack_2ae) * uVar78 |
                          (ushort)((short)uVar78 >= sStack_2ae) * sStack_2ae,
                          ((short)uVar74 < sStack_2b0) * uVar74 |
                          (ushort)((short)uVar74 >= sStack_2b0) * sStack_2b0);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT24(((short)uVar81 < sStack_2ac) * uVar81 |
                          (ushort)((short)uVar81 >= sStack_2ac) * sStack_2ac,
                          (undefined4)vSaturationCheckMin[0]);
            vSaturationCheckMin[0] =
                 CONCAT26(((short)uVar84 < sStack_2aa) * uVar84 |
                          (ushort)((short)uVar84 >= sStack_2aa) * sStack_2aa,
                          (undefined6)vSaturationCheckMin[0]);
            local_738 = (short)result;
            sStack_736 = (short)((ulong)result >> 0x10);
            sStack_734 = (short)((ulong)result >> 0x20);
            sStack_732 = (short)((ulong)result >> 0x30);
            sStack_730 = (short)vSaturationCheckMax[0];
            sStack_72e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_72c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_72a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            uVar60 = (local_738 < (short)uVar60) * uVar60 |
                     (ushort)(local_738 >= (short)uVar60) * local_738;
            uVar65 = (sStack_736 < (short)uVar65) * uVar65 |
                     (ushort)(sStack_736 >= (short)uVar65) * sStack_736;
            uVar68 = (sStack_734 < (short)uVar68) * uVar68 |
                     (ushort)(sStack_734 >= (short)uVar68) * sStack_734;
            uVar71 = (sStack_732 < (short)uVar71) * uVar71 |
                     (ushort)(sStack_732 >= (short)uVar71) * sStack_732;
            uVar74 = (sStack_730 < (short)uVar74) * uVar74 |
                     (ushort)(sStack_730 >= (short)uVar74) * sStack_730;
            uVar78 = (sStack_72e < (short)uVar78) * uVar78 |
                     (ushort)(sStack_72e >= (short)uVar78) * sStack_72e;
            uVar81 = (sStack_72c < (short)uVar81) * uVar81 |
                     (ushort)(sStack_72c >= (short)uVar81) * sStack_72c;
            uVar84 = (sStack_72a < (short)uVar84) * uVar84 |
                     (ushort)(sStack_72a >= (short)uVar84) * sStack_72a;
            local_768 = auVar87._0_2_;
            sStack_766 = auVar87._2_2_;
            sStack_764 = auVar87._4_2_;
            sStack_762 = auVar87._6_2_;
            sStack_760 = auVar87._8_2_;
            sStack_75e = auVar87._10_2_;
            sStack_75c = auVar87._12_2_;
            sStack_75a = auVar87._14_2_;
            uVar60 = (ushort)((short)uVar60 < local_768) * local_768 |
                     ((short)uVar60 >= local_768) * uVar60;
            uVar65 = (ushort)((short)uVar65 < sStack_766) * sStack_766 |
                     ((short)uVar65 >= sStack_766) * uVar65;
            uVar68 = (ushort)((short)uVar68 < sStack_764) * sStack_764 |
                     ((short)uVar68 >= sStack_764) * uVar68;
            uVar71 = (ushort)((short)uVar71 < sStack_762) * sStack_762 |
                     ((short)uVar71 >= sStack_762) * uVar71;
            uVar74 = (ushort)((short)uVar74 < sStack_760) * sStack_760 |
                     ((short)uVar74 >= sStack_760) * uVar74;
            uVar78 = (ushort)((short)uVar78 < sStack_75e) * sStack_75e |
                     ((short)uVar78 >= sStack_75e) * uVar78;
            uVar81 = (ushort)((short)uVar81 < sStack_75c) * sStack_75c |
                     ((short)uVar81 >= sStack_75c) * uVar81;
            uVar84 = (ushort)((short)uVar84 < sStack_75a) * sStack_75a |
                     ((short)uVar84 >= sStack_75a) * uVar84;
            local_788 = auVar88._0_2_;
            sStack_786 = auVar88._2_2_;
            sStack_784 = auVar88._4_2_;
            sStack_782 = auVar88._6_2_;
            sStack_780 = auVar88._8_2_;
            sStack_77e = auVar88._10_2_;
            sStack_77c = auVar88._12_2_;
            sStack_77a = auVar88._14_2_;
            uVar60 = (ushort)((short)uVar60 < local_788) * local_788 |
                     ((short)uVar60 >= local_788) * uVar60;
            uVar65 = (ushort)((short)uVar65 < sStack_786) * sStack_786 |
                     ((short)uVar65 >= sStack_786) * uVar65;
            uVar68 = (ushort)((short)uVar68 < sStack_784) * sStack_784 |
                     ((short)uVar68 >= sStack_784) * uVar68;
            uVar71 = (ushort)((short)uVar71 < sStack_782) * sStack_782 |
                     ((short)uVar71 >= sStack_782) * uVar71;
            uVar74 = (ushort)((short)uVar74 < sStack_780) * sStack_780 |
                     ((short)uVar74 >= sStack_780) * uVar74;
            uVar78 = (ushort)((short)uVar78 < sStack_77e) * sStack_77e |
                     ((short)uVar78 >= sStack_77e) * uVar78;
            uVar81 = (ushort)((short)uVar81 < sStack_77c) * sStack_77c |
                     ((short)uVar81 >= sStack_77c) * uVar81;
            uVar84 = (ushort)((short)uVar84 < sStack_77a) * sStack_77a |
                     ((short)uVar84 >= sStack_77a) * uVar84;
            local_7a8 = auVar89._0_2_;
            sStack_7a6 = auVar89._2_2_;
            sStack_7a4 = auVar89._4_2_;
            sStack_7a2 = auVar89._6_2_;
            sStack_7a0 = auVar89._8_2_;
            sStack_79e = auVar89._10_2_;
            sStack_79c = auVar89._12_2_;
            sStack_79a = auVar89._14_2_;
            result._0_4_ = CONCAT22((ushort)((short)uVar65 < sStack_7a6) * sStack_7a6 |
                                    ((short)uVar65 >= sStack_7a6) * uVar65,
                                    (ushort)((short)uVar60 < local_7a8) * local_7a8 |
                                    ((short)uVar60 >= local_7a8) * uVar60);
            result._0_6_ = CONCAT24((ushort)((short)uVar68 < sStack_7a4) * sStack_7a4 |
                                    ((short)uVar68 >= sStack_7a4) * uVar68,result._0_4_);
            result = (parasail_result_t *)
                     CONCAT26((ushort)((short)uVar71 < sStack_7a2) * sStack_7a2 |
                              ((short)uVar71 >= sStack_7a2) * uVar71,result._0_6_);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT22((ushort)((short)uVar78 < sStack_79e) * sStack_79e |
                          ((short)uVar78 >= sStack_79e) * uVar78,
                          (ushort)((short)uVar74 < sStack_7a0) * sStack_7a0 |
                          ((short)uVar74 >= sStack_7a0) * uVar74);
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT24((ushort)((short)uVar81 < sStack_79c) * sStack_79c |
                          ((short)uVar81 >= sStack_79c) * uVar81,(undefined4)vSaturationCheckMax[0])
            ;
            vSaturationCheckMax[0] =
                 CONCAT26((ushort)((short)uVar84 < sStack_79a) * sStack_79a |
                          ((short)uVar84 >= sStack_79a) * uVar84,(undefined6)vSaturationCheckMax[0])
            ;
            auVar48._8_8_ = vH[0];
            auVar48._0_8_ = vH_dag[1];
            auVar47._8_8_ = uVar14;
            auVar47._0_8_ = uVar11;
            auVar64 = psubsw(auVar48,auVar47);
            auVar46._8_8_ = uVar15;
            auVar46._0_8_ = uVar12;
            auVar92 = psubsw((undefined1  [16])alVar94,auVar46);
            local_7b8 = auVar64._0_2_;
            sStack_7b6 = auVar64._2_2_;
            sStack_7b4 = auVar64._4_2_;
            sStack_7b2 = auVar64._6_2_;
            sStack_7b0 = auVar64._8_2_;
            sStack_7ae = auVar64._10_2_;
            sStack_7ac = auVar64._12_2_;
            sStack_7aa = auVar64._14_2_;
            local_7c8 = auVar92._0_2_;
            sStack_7c6 = auVar92._2_2_;
            sStack_7c4 = auVar92._4_2_;
            sStack_7c2 = auVar92._6_2_;
            sStack_7c0 = auVar92._8_2_;
            sStack_7be = auVar92._10_2_;
            sStack_7bc = auVar92._12_2_;
            sStack_7ba = auVar92._14_2_;
            vE_ext[1] = CONCAT26((ushort)(sStack_7b2 < sStack_7c2) * sStack_7c2 |
                                 (ushort)(sStack_7b2 >= sStack_7c2) * sStack_7b2,
                                 CONCAT24((ushort)(sStack_7b4 < sStack_7c4) * sStack_7c4 |
                                          (ushort)(sStack_7b4 >= sStack_7c4) * sStack_7b4,
                                          CONCAT22((ushort)(sStack_7b6 < sStack_7c6) * sStack_7c6 |
                                                   (ushort)(sStack_7b6 >= sStack_7c6) * sStack_7b6,
                                                   (ushort)(local_7b8 < local_7c8) * local_7c8 |
                                                   (ushort)(local_7b8 >= local_7c8) * local_7b8)));
            vE[0] = CONCAT26((ushort)(sStack_7aa < sStack_7ba) * sStack_7ba |
                             (ushort)(sStack_7aa >= sStack_7ba) * sStack_7aa,
                             CONCAT24((ushort)(sStack_7ac < sStack_7bc) * sStack_7bc |
                                      (ushort)(sStack_7ac >= sStack_7bc) * sStack_7ac,
                                      CONCAT22((ushort)(sStack_7ae < sStack_7be) * sStack_7be |
                                               (ushort)(sStack_7ae >= sStack_7be) * sStack_7ae,
                                               (ushort)(sStack_7b0 < sStack_7c0) * sStack_7c0 |
                                               (ushort)(sStack_7b0 >= sStack_7c0) * sStack_7b0)));
            sVar61 = -(ushort)(local_7c8 < local_7b8);
            sVar62 = -(ushort)(sStack_7c6 < sStack_7b6);
            sVar66 = -(ushort)(sStack_7c4 < sStack_7b4);
            sVar67 = -(ushort)(sStack_7c2 < sStack_7b2);
            sVar69 = -(ushort)(sStack_7c0 < sStack_7b0);
            sVar70 = -(ushort)(sStack_7be < sStack_7ae);
            sVar72 = -(ushort)(sStack_7bc < sStack_7ac);
            sVar73 = -(ushort)(sStack_7ba < sStack_7aa);
            auVar33._2_2_ = sVar62;
            auVar33._0_2_ = sVar61;
            auVar33._4_2_ = sVar66;
            auVar33._6_2_ = sVar67;
            auVar33._10_2_ = sVar70;
            auVar33._8_2_ = sVar69;
            auVar33._12_2_ = sVar72;
            auVar33._14_2_ = sVar73;
            auVar64 = pblendvb((undefined1  [16])alVar95,auVar87,auVar33);
            auVar32._2_2_ = sVar62;
            auVar32._0_2_ = sVar61;
            auVar32._4_2_ = sVar66;
            auVar32._6_2_ = sVar67;
            auVar32._10_2_ = sVar70;
            auVar32._8_2_ = sVar69;
            auVar32._12_2_ = sVar72;
            auVar32._14_2_ = sVar73;
            auVar92 = pblendvb((undefined1  [16])alVar96,auVar88,auVar32);
            auVar93._8_8_ = 0x1000100010001;
            auVar93._0_8_ = 0x1000100010001;
            auVar93 = paddsw((undefined1  [16])alVar97,auVar93);
            auVar90._8_8_ = 0x1000100010001;
            auVar90._0_8_ = 0x1000100010001;
            auVar90 = paddsw(auVar89,auVar90);
            auVar31._2_2_ = sVar62;
            auVar31._0_2_ = sVar61;
            auVar31._4_2_ = sVar66;
            auVar31._6_2_ = sVar67;
            auVar31._10_2_ = sVar70;
            auVar31._8_2_ = sVar69;
            auVar31._12_2_ = sVar72;
            auVar31._14_2_ = sVar73;
            auVar90 = pblendvb(auVar93,auVar90,auVar31);
            ptr[k][0] = vE_ext[1];
            ptr[k][1] = vE[0];
            vES[1] = auVar64._0_8_;
            vEM[0] = auVar64._8_8_;
            b[k][0] = vES[1];
            b[k][1] = vEM[0];
            vEL[1] = auVar92._0_8_;
            vES[0] = auVar92._8_8_;
            b_00[k][0] = vEL[1];
            b_00[k][1] = vES[0];
            vF[1] = auVar90._0_8_;
            vEL[0] = auVar90._8_8_;
            b_01[k][0] = vF[1];
            b_01[k][1] = vEL[0];
            auVar45._8_8_ = vF[0];
            auVar45._0_8_ = vF_ext[1];
            auVar44._8_8_ = uVar15;
            auVar44._0_8_ = uVar12;
            auVar64 = psubsw(auVar45,auVar44);
            local_7e8 = auVar64._0_2_;
            sStack_7e6 = auVar64._2_2_;
            sStack_7e4 = auVar64._4_2_;
            sStack_7e2 = auVar64._6_2_;
            sStack_7e0 = auVar64._8_2_;
            sStack_7de = auVar64._10_2_;
            sStack_7dc = auVar64._12_2_;
            sStack_7da = auVar64._14_2_;
            vF_ext[1] = CONCAT26((ushort)(sStack_7b2 < sStack_7e2) * sStack_7e2 |
                                 (ushort)(sStack_7b2 >= sStack_7e2) * sStack_7b2,
                                 CONCAT24((ushort)(sStack_7b4 < sStack_7e4) * sStack_7e4 |
                                          (ushort)(sStack_7b4 >= sStack_7e4) * sStack_7b4,
                                          CONCAT22((ushort)(sStack_7b6 < sStack_7e6) * sStack_7e6 |
                                                   (ushort)(sStack_7b6 >= sStack_7e6) * sStack_7b6,
                                                   (ushort)(local_7b8 < local_7e8) * local_7e8 |
                                                   (ushort)(local_7b8 >= local_7e8) * local_7b8)));
            vF[0] = CONCAT26((ushort)(sStack_7aa < sStack_7da) * sStack_7da |
                             (ushort)(sStack_7aa >= sStack_7da) * sStack_7aa,
                             CONCAT24((ushort)(sStack_7ac < sStack_7dc) * sStack_7dc |
                                      (ushort)(sStack_7ac >= sStack_7dc) * sStack_7ac,
                                      CONCAT22((ushort)(sStack_7ae < sStack_7de) * sStack_7de |
                                               (ushort)(sStack_7ae >= sStack_7de) * sStack_7ae,
                                               (ushort)(sStack_7b0 < sStack_7e0) * sStack_7e0 |
                                               (ushort)(sStack_7b0 >= sStack_7e0) * sStack_7b0)));
            sVar61 = -(ushort)(local_7e8 < local_7b8);
            sVar62 = -(ushort)(sStack_7e6 < sStack_7b6);
            sVar66 = -(ushort)(sStack_7e4 < sStack_7b4);
            sVar67 = -(ushort)(sStack_7e2 < sStack_7b2);
            sVar69 = -(ushort)(sStack_7e0 < sStack_7b0);
            sVar70 = -(ushort)(sStack_7de < sStack_7ae);
            sVar72 = -(ushort)(sStack_7dc < sStack_7ac);
            sVar73 = -(ushort)(sStack_7da < sStack_7aa);
            auVar30._2_2_ = sVar62;
            auVar30._0_2_ = sVar61;
            auVar30._4_2_ = sVar66;
            auVar30._6_2_ = sVar67;
            auVar30._10_2_ = sVar70;
            auVar30._8_2_ = sVar69;
            auVar30._12_2_ = sVar72;
            auVar30._14_2_ = sVar73;
            register0x00001240 = pblendvb(stack0xfffffffffffff118,auVar87,auVar30);
            auVar29._2_2_ = sVar62;
            auVar29._0_2_ = sVar61;
            auVar29._4_2_ = sVar66;
            auVar29._6_2_ = sVar67;
            auVar29._10_2_ = sVar70;
            auVar29._8_2_ = sVar69;
            auVar29._12_2_ = sVar72;
            auVar29._14_2_ = sVar73;
            register0x00001240 = pblendvb(stack0xfffffffffffff108,auVar88,auVar29);
            auVar92._8_8_ = 0x1000100010001;
            auVar92._0_8_ = 0x1000100010001;
            auVar92 = paddsw(stack0xfffffffffffff0f8,auVar92);
            auVar64._8_8_ = 0x1000100010001;
            auVar64._0_8_ = 0x1000100010001;
            auVar64 = paddsw(auVar89,auVar64);
            auVar88._2_2_ = sVar62;
            auVar88._0_2_ = sVar61;
            auVar88._4_2_ = sVar66;
            auVar88._6_2_ = sVar67;
            auVar88._10_2_ = sVar70;
            auVar88._8_2_ = sVar69;
            auVar88._12_2_ = sVar72;
            auVar88._14_2_ = sVar73;
            register0x00001240 = pblendvb(auVar92,auVar64,auVar88);
            vH_dag[1] = pvHLoad[k][0];
            vH[0] = pvHLoad[k][1];
            unique0x100043cb = pvHMLoad[k];
            unique0x100043db = pvHSLoad[k];
            _vP = pvHLLoad[k];
          }
          for (end_query = 0; end_query < 8; end_query = end_query + 1) {
            uVar63 = pvHLoad[iVar54 + -1][0];
            local_1078 = (ulong)(ptr_00[s1Len + 1] - open);
            if ((long)local_1078 < -0x8000) {
              local_1078 = 0xffffffffffff8000;
            }
            vF[0] = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            vFM[0] = vFM[0] << 0x10 | (ulong)vFS[1] >> 0x30;
            vFS[1] = vFS[1] << 0x10;
            vFS[0] = vFS[0] << 0x10 | (ulong)vFL[1] >> 0x30;
            vFL[1] = vFL[1] << 0x10;
            vHp[0] = pvHLoad[iVar54 + -1][1] << 0x10 | uVar63 >> 0x30;
            tmp_6 = uVar63 << 0x10 | (ulong)(ushort)ptr_00[s1Len];
            vF_ext[1] = vF_ext[1] << 0x10 | local_1078 & 0xffff;
            vFL[0] = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
            vH[1] = vH[1] << 0x10 | 1;
            for (k = 0; k < iVar54; k = k + 1) {
              auVar64 = paddsw((undefined1  [16])_tmp_6,
                               *(undefined1 (*) [16])
                                ((long)pvVar4 + (long)k * 0x10 + (long)iVar58 * 0x10));
              lVar19 = pvHMStore[k][0];
              lVar20 = pvHMStore[k][1];
              local_7f8 = (short)lVar19;
              sStack_7f6 = (short)((ulong)lVar19 >> 0x10);
              sStack_7f4 = (short)((ulong)lVar19 >> 0x20);
              sStack_7f2 = (short)((ulong)lVar19 >> 0x30);
              sStack_7f0 = (short)lVar20;
              sStack_7ee = (short)((ulong)lVar20 >> 0x10);
              sStack_7ec = (short)((ulong)lVar20 >> 0x20);
              sStack_7ea = (short)((ulong)lVar20 >> 0x30);
              local_808 = (ushort)vF_ext[1];
              uStack_806 = (ushort)((ulong)vF_ext[1] >> 0x10);
              uStack_804 = (ushort)((ulong)vF_ext[1] >> 0x20);
              uStack_802 = (ushort)((ulong)vF_ext[1] >> 0x30);
              uStack_800 = (ushort)vF[0];
              uStack_7fe = (ushort)((ulong)vF[0] >> 0x10);
              uStack_7fc = (ushort)((ulong)vF[0] >> 0x20);
              uStack_7fa = (ushort)((ulong)vF[0] >> 0x30);
              uVar60 = (local_7f8 < (short)local_808) * local_808 |
                       (ushort)(local_7f8 >= (short)local_808) * local_7f8;
              uVar65 = (sStack_7f6 < (short)uStack_806) * uStack_806 |
                       (ushort)(sStack_7f6 >= (short)uStack_806) * sStack_7f6;
              uVar68 = (sStack_7f4 < (short)uStack_804) * uStack_804 |
                       (ushort)(sStack_7f4 >= (short)uStack_804) * sStack_7f4;
              uVar71 = (sStack_7f2 < (short)uStack_802) * uStack_802 |
                       (ushort)(sStack_7f2 >= (short)uStack_802) * sStack_7f2;
              uVar74 = (sStack_7f0 < (short)uStack_800) * uStack_800 |
                       (ushort)(sStack_7f0 >= (short)uStack_800) * sStack_7f0;
              uVar78 = (sStack_7ee < (short)uStack_7fe) * uStack_7fe |
                       (ushort)(sStack_7ee >= (short)uStack_7fe) * sStack_7ee;
              uVar81 = (sStack_7ec < (short)uStack_7fc) * uStack_7fc |
                       (ushort)(sStack_7ec >= (short)uStack_7fc) * sStack_7ec;
              uVar84 = (sStack_7ea < (short)uStack_7fa) * uStack_7fa |
                       (ushort)(sStack_7ea >= (short)uStack_7fa) * sStack_7ea;
              vH_dag[1]._0_4_ = CONCAT22(uVar65,uVar60);
              vH_dag[1]._0_6_ = CONCAT24(uVar68,(undefined4)vH_dag[1]);
              vH_dag[1] = CONCAT26(uVar71,(undefined6)vH_dag[1]);
              vH[0]._0_4_ = CONCAT22(uVar78,uVar74);
              vH[0]._0_6_ = CONCAT24(uVar81,(undefined4)vH[0]);
              vH[0] = CONCAT26(uVar84,(undefined6)vH[0]);
              pvHMStore[k][0] = vH_dag[1];
              pvHMStore[k][1] = vH[0];
              local_6a8 = auVar64._0_2_;
              uStack_6a6 = auVar64._2_2_;
              uStack_6a4 = auVar64._4_2_;
              uStack_6a2 = auVar64._6_2_;
              uStack_6a0 = auVar64._8_2_;
              uStack_69e = auVar64._10_2_;
              uStack_69c = auVar64._12_2_;
              uStack_69a = auVar64._14_2_;
              uVar63 = ~CONCAT26(-(ushort)(uVar71 == uStack_6a2),
                                 CONCAT24(-(ushort)(uVar68 == uStack_6a4),
                                          CONCAT22(-(ushort)(uVar65 == uStack_6a6),
                                                   -(ushort)(uVar60 == local_6a8)))) &
                       CONCAT26(-(ushort)(uVar71 == uStack_802),
                                CONCAT24(-(ushort)(uVar68 == uStack_804),
                                         CONCAT22(-(ushort)(uVar65 == uStack_806),
                                                  -(ushort)(uVar60 == local_808))));
              uVar77 = ~CONCAT26(-(ushort)(uVar84 == uStack_69a),
                                 CONCAT24(-(ushort)(uVar81 == uStack_69c),
                                          CONCAT22(-(ushort)(uVar78 == uStack_69e),
                                                   -(ushort)(uVar74 == uStack_6a0)))) &
                       CONCAT26(-(ushort)(uVar84 == uStack_7fa),
                                CONCAT24(-(ushort)(uVar81 == uStack_7fc),
                                         CONCAT22(-(ushort)(uVar78 == uStack_7fe),
                                                  -(ushort)(uVar74 == uStack_800))));
              auVar28._8_8_ = uVar77;
              auVar28._0_8_ = uVar63;
              auVar90 = pblendvb((undefined1  [16])pvHSStore[k],stack0xfffffffffffff118,auVar28);
              vHS[1] = auVar90._0_8_;
              vHM[0] = auVar90._8_8_;
              pvHSStore[k][0] = vHS[1];
              pvHSStore[k][1] = vHM[0];
              auVar27._8_8_ = uVar77;
              auVar27._0_8_ = uVar63;
              auVar93 = pblendvb((undefined1  [16])pvHLStore[k],stack0xfffffffffffff108,auVar27);
              vHL[1] = auVar93._0_8_;
              vHS[0] = auVar93._8_8_;
              pvHLStore[k][0] = vHL[1];
              pvHLStore[k][1] = vHS[0];
              auVar26._8_8_ = uVar77;
              auVar26._0_8_ = uVar63;
              auVar89 = pblendvb((undefined1  [16])pvE[k],stack0xfffffffffffff0f8,auVar26);
              vP = auVar89._0_8_;
              vHL[0] = auVar89._8_8_;
              pvE[k][0] = (longlong)vP;
              pvE[k][1] = vHL[0];
              local_2d8 = (short)vSaturationCheckMax[1];
              sStack_2d6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_2d4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_2d2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_2d0 = (short)vSaturationCheckMin[0];
              sStack_2ce = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_2cc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_2ca = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT22(((short)uVar65 < sStack_2d6) * uVar65 |
                            (ushort)((short)uVar65 >= sStack_2d6) * sStack_2d6,
                            ((short)uVar60 < local_2d8) * uVar60 |
                            (ushort)((short)uVar60 >= local_2d8) * local_2d8);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT24(((short)uVar68 < sStack_2d4) * uVar68 |
                            (ushort)((short)uVar68 >= sStack_2d4) * sStack_2d4,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT26(((short)uVar71 < sStack_2d2) * uVar71 |
                            (ushort)((short)uVar71 >= sStack_2d2) * sStack_2d2,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT22(((short)uVar78 < sStack_2ce) * uVar78 |
                            (ushort)((short)uVar78 >= sStack_2ce) * sStack_2ce,
                            ((short)uVar74 < sStack_2d0) * uVar74 |
                            (ushort)((short)uVar74 >= sStack_2d0) * sStack_2d0);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT24(((short)uVar81 < sStack_2cc) * uVar81 |
                            (ushort)((short)uVar81 >= sStack_2cc) * sStack_2cc,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT26(((short)uVar84 < sStack_2ca) * uVar84 |
                            (ushort)((short)uVar84 >= sStack_2ca) * sStack_2ca,
                            (undefined6)vSaturationCheckMin[0]);
              local_818 = (short)result;
              sStack_816 = (short)((ulong)result >> 0x10);
              sStack_814 = (short)((ulong)result >> 0x20);
              sStack_812 = (short)((ulong)result >> 0x30);
              sStack_810 = (short)vSaturationCheckMax[0];
              sStack_80e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_80c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_80a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              uVar60 = (local_818 < (short)uVar60) * uVar60 |
                       (ushort)(local_818 >= (short)uVar60) * local_818;
              uVar65 = (sStack_816 < (short)uVar65) * uVar65 |
                       (ushort)(sStack_816 >= (short)uVar65) * sStack_816;
              uVar68 = (sStack_814 < (short)uVar68) * uVar68 |
                       (ushort)(sStack_814 >= (short)uVar68) * sStack_814;
              uVar71 = (sStack_812 < (short)uVar71) * uVar71 |
                       (ushort)(sStack_812 >= (short)uVar71) * sStack_812;
              uVar74 = (sStack_810 < (short)uVar74) * uVar74 |
                       (ushort)(sStack_810 >= (short)uVar74) * sStack_810;
              uVar78 = (sStack_80e < (short)uVar78) * uVar78 |
                       (ushort)(sStack_80e >= (short)uVar78) * sStack_80e;
              uVar81 = (sStack_80c < (short)uVar81) * uVar81 |
                       (ushort)(sStack_80c >= (short)uVar81) * sStack_80c;
              uVar84 = (sStack_80a < (short)uVar84) * uVar84 |
                       (ushort)(sStack_80a >= (short)uVar84) * sStack_80a;
              local_848 = auVar90._0_2_;
              sStack_846 = auVar90._2_2_;
              sStack_844 = auVar90._4_2_;
              sStack_842 = auVar90._6_2_;
              sStack_840 = auVar90._8_2_;
              sStack_83e = auVar90._10_2_;
              sStack_83c = auVar90._12_2_;
              sStack_83a = auVar90._14_2_;
              uVar60 = (ushort)((short)uVar60 < local_848) * local_848 |
                       ((short)uVar60 >= local_848) * uVar60;
              uVar65 = (ushort)((short)uVar65 < sStack_846) * sStack_846 |
                       ((short)uVar65 >= sStack_846) * uVar65;
              uVar68 = (ushort)((short)uVar68 < sStack_844) * sStack_844 |
                       ((short)uVar68 >= sStack_844) * uVar68;
              uVar71 = (ushort)((short)uVar71 < sStack_842) * sStack_842 |
                       ((short)uVar71 >= sStack_842) * uVar71;
              uVar74 = (ushort)((short)uVar74 < sStack_840) * sStack_840 |
                       ((short)uVar74 >= sStack_840) * uVar74;
              uVar78 = (ushort)((short)uVar78 < sStack_83e) * sStack_83e |
                       ((short)uVar78 >= sStack_83e) * uVar78;
              uVar81 = (ushort)((short)uVar81 < sStack_83c) * sStack_83c |
                       ((short)uVar81 >= sStack_83c) * uVar81;
              uVar84 = (ushort)((short)uVar84 < sStack_83a) * sStack_83a |
                       ((short)uVar84 >= sStack_83a) * uVar84;
              local_868 = auVar93._0_2_;
              sStack_866 = auVar93._2_2_;
              sStack_864 = auVar93._4_2_;
              sStack_862 = auVar93._6_2_;
              sStack_860 = auVar93._8_2_;
              sStack_85e = auVar93._10_2_;
              sStack_85c = auVar93._12_2_;
              sStack_85a = auVar93._14_2_;
              uVar60 = (ushort)((short)uVar60 < local_868) * local_868 |
                       ((short)uVar60 >= local_868) * uVar60;
              uVar65 = (ushort)((short)uVar65 < sStack_866) * sStack_866 |
                       ((short)uVar65 >= sStack_866) * uVar65;
              uVar68 = (ushort)((short)uVar68 < sStack_864) * sStack_864 |
                       ((short)uVar68 >= sStack_864) * uVar68;
              uVar71 = (ushort)((short)uVar71 < sStack_862) * sStack_862 |
                       ((short)uVar71 >= sStack_862) * uVar71;
              uVar74 = (ushort)((short)uVar74 < sStack_860) * sStack_860 |
                       ((short)uVar74 >= sStack_860) * uVar74;
              uVar78 = (ushort)((short)uVar78 < sStack_85e) * sStack_85e |
                       ((short)uVar78 >= sStack_85e) * uVar78;
              uVar81 = (ushort)((short)uVar81 < sStack_85c) * sStack_85c |
                       ((short)uVar81 >= sStack_85c) * uVar81;
              uVar84 = (ushort)((short)uVar84 < sStack_85a) * sStack_85a |
                       ((short)uVar84 >= sStack_85a) * uVar84;
              local_888 = auVar89._0_2_;
              sStack_886 = auVar89._2_2_;
              sStack_884 = auVar89._4_2_;
              sStack_882 = auVar89._6_2_;
              sStack_880 = auVar89._8_2_;
              sStack_87e = auVar89._10_2_;
              sStack_87c = auVar89._12_2_;
              sStack_87a = auVar89._14_2_;
              result._0_4_ = CONCAT22((ushort)((short)uVar65 < sStack_886) * sStack_886 |
                                      ((short)uVar65 >= sStack_886) * uVar65,
                                      (ushort)((short)uVar60 < local_888) * local_888 |
                                      ((short)uVar60 >= local_888) * uVar60);
              result._0_6_ = CONCAT24((ushort)((short)uVar68 < sStack_884) * sStack_884 |
                                      ((short)uVar68 >= sStack_884) * uVar68,result._0_4_);
              result = (parasail_result_t *)
                       CONCAT26((ushort)((short)uVar71 < sStack_882) * sStack_882 |
                                ((short)uVar71 >= sStack_882) * uVar71,result._0_6_);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT22((ushort)((short)uVar78 < sStack_87e) * sStack_87e |
                            ((short)uVar78 >= sStack_87e) * uVar78,
                            (ushort)((short)uVar74 < sStack_880) * sStack_880 |
                            ((short)uVar74 >= sStack_880) * uVar74);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT24((ushort)((short)uVar81 < sStack_87c) * sStack_87c |
                            ((short)uVar81 >= sStack_87c) * uVar81,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)((short)uVar84 < sStack_87a) * sStack_87a |
                            ((short)uVar84 >= sStack_87a) * uVar84,
                            (undefined6)vSaturationCheckMax[0]);
              auVar43._8_8_ = vH[0];
              auVar43._0_8_ = vH_dag[1];
              auVar42._8_8_ = uVar14;
              auVar42._0_8_ = uVar11;
              auVar64 = psubsw(auVar43,auVar42);
              auVar41._8_8_ = vF[0];
              auVar41._0_8_ = vF_ext[1];
              auVar40._8_8_ = uVar15;
              auVar40._0_8_ = uVar12;
              auVar92 = psubsw(auVar41,auVar40);
              vFM[1] = auVar92._0_8_;
              vF_ext[0] = auVar92._8_8_;
              local_1b8 = auVar92._0_2_;
              sStack_1b6 = auVar92._2_2_;
              sStack_1b4 = auVar92._4_2_;
              sStack_1b2 = auVar92._6_2_;
              sStack_1b0 = auVar92._8_2_;
              sStack_1ae = auVar92._10_2_;
              sStack_1ac = auVar92._12_2_;
              sStack_1aa = auVar92._14_2_;
              local_1c8 = auVar64._0_2_;
              sStack_1c6 = auVar64._2_2_;
              sStack_1c4 = auVar64._4_2_;
              sStack_1c2 = auVar64._6_2_;
              sStack_1c0 = auVar64._8_2_;
              sStack_1be = auVar64._10_2_;
              sStack_1bc = auVar64._12_2_;
              sStack_1ba = auVar64._14_2_;
              auVar91._0_8_ =
                   CONCAT26(-(ushort)(sStack_1c2 < sStack_1b2),
                            CONCAT24(-(ushort)(sStack_1c4 < sStack_1b4),
                                     CONCAT22(-(ushort)(sStack_1c6 < sStack_1b6),
                                              -(ushort)(local_1c8 < local_1b8))));
              auVar91._8_2_ = -(ushort)(sStack_1c0 < sStack_1b0);
              auVar91._10_2_ = -(ushort)(sStack_1be < sStack_1ae);
              auVar91._12_2_ = -(ushort)(sStack_1bc < sStack_1ac);
              auVar91._14_2_ = -(ushort)(sStack_1ba < sStack_1aa);
              uStack_f0 = auVar91._8_8_;
              uStack_f0 = uStack_f0 |
                          CONCAT26(-(ushort)(sStack_1aa == sStack_1ba),
                                   CONCAT24(-(ushort)(sStack_1ac == sStack_1bc),
                                            CONCAT22(-(ushort)(sStack_1ae == sStack_1be),
                                                     -(ushort)(sStack_1b0 == sStack_1c0))));
              auVar50._8_8_ = uStack_f0;
              auVar50._0_8_ =
                   auVar91._0_8_ |
                   CONCAT26(-(ushort)(sStack_1b2 == sStack_1c2),
                            CONCAT24(-(ushort)(sStack_1b4 == sStack_1c4),
                                     CONCAT22(-(ushort)(sStack_1b6 == sStack_1c6),
                                              -(ushort)(local_1b8 == local_1c8))));
              if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar50 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar50 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar50 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar50 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar50 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (uStack_f0 >> 7 & 1) == 0) && (uStack_f0 >> 0xf & 1) == 0) &&
                      (uStack_f0 >> 0x17 & 1) == 0) && (uStack_f0 >> 0x1f & 1) == 0) &&
                    (uStack_f0 >> 0x27 & 1) == 0) && (uStack_f0 >> 0x2f & 1) == 0) &&
                  (uStack_f0 >> 0x37 & 1) == 0) && -1 < (long)uStack_f0) goto LAB_00941fe5;
              vF_ext[1] = vFM[1];
              vF[0] = vF_ext[0];
              vH_1[1] = CONCAT26(-(ushort)(sStack_1b2 < sStack_1c2),
                                 CONCAT24(-(ushort)(sStack_1b4 < sStack_1c4),
                                          CONCAT22(-(ushort)(sStack_1b6 < sStack_1c6),
                                                   -(ushort)(local_1b8 < local_1c8))));
              cond[0] = CONCAT26(-(ushort)(sStack_1aa < sStack_1ba),
                                 CONCAT24(-(ushort)(sStack_1ac < sStack_1bc),
                                          CONCAT22(-(ushort)(sStack_1ae < sStack_1be),
                                                   -(ushort)(sStack_1b0 < sStack_1c0))));
              auVar25._8_8_ = cond[0];
              auVar25._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(stack0xfffffffffffff118,auVar90,auVar25);
              auVar24._8_8_ = cond[0];
              auVar24._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(stack0xfffffffffffff108,auVar93,auVar24);
              auVar22._8_8_ = 0x1000100010001;
              auVar22._0_8_ = 0x1000100010001;
              auVar92 = paddsw(stack0xfffffffffffff0f8,auVar22);
              auVar21._8_8_ = 0x1000100010001;
              auVar21._0_8_ = 0x1000100010001;
              auVar64 = paddsw(auVar89,auVar21);
              auVar23._8_8_ = cond[0];
              auVar23._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(auVar92,auVar64,auVar23);
              _tmp_6 = pvHLoad[k];
            }
          }
LAB_00941fe5:
          pvE = pvHLLoad;
          pvHLLoad = palVar10;
          pvHLStore = pvHSLoad;
          pvHSLoad = palVar9;
          pvHSStore = pvHMLoad;
          pvHMLoad = palVar8;
          pvHMStore = pvHLoad;
          pvHLoad = palVar7;
        }
        vH_1[0] = pvHLoad[iVar59][1];
        vHM_1[0] = pvHMLoad[iVar59][1];
        vHS_1[0] = pvHSLoad[iVar59][1];
        vHL_1[0] = pvHLLoad[iVar59][1];
        uStack_1048 = pvHLLoad[iVar59][0];
        vHL_1[1] = pvHSLoad[iVar59][0];
        vHS_1[1] = pvHMLoad[iVar59][0];
        vHM_1[1] = pvHLoad[iVar59][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar54) + 8U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 0x10 | (ulong)vHM_1[1] >> 0x30;
          vHM_1[0] = vHM_1[0] << 0x10 | (ulong)vHS_1[1] >> 0x30;
          vHS_1[0] = vHS_1[0] << 0x10 | (ulong)vHL_1[1] >> 0x30;
          vHL_1[0] = vHL_1[0] << 0x10 | uStack_1048 >> 0x30;
          uStack_1048 = uStack_1048 << 0x10;
          vHL_1[1] = vHL_1[1] << 0x10;
          vHS_1[1] = vHS_1[1] << 0x10;
          vHM_1[1] = vHM_1[1] << 0x10;
        }
        local_dca = vH_1[0]._6_2_;
        local_dcc = vHM_1[0]._6_2_;
        local_dce = vHS_1[0]._6_2_;
        local_dd0 = vHL_1[0]._6_2_;
        local_c8 = (short)vSaturationCheckMax[1];
        sStack_c6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_c4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_c2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_c0 = (short)vSaturationCheckMin[0];
        sStack_be = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_bc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_ba = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_1f8 = (short)result;
        sStack_1f6 = (short)((ulong)result >> 0x10);
        sStack_1f4 = (short)((ulong)result >> 0x20);
        sStack_1f2 = (short)((ulong)result >> 0x30);
        sStack_1f0 = (short)vSaturationCheckMax[0];
        sStack_1ee = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_1ec = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_1ea = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar63 = CONCAT26(-(ushort)(sStack_ba < sVar52),
                          CONCAT24(-(ushort)(sStack_bc < sVar52),
                                   CONCAT22(-(ushort)(sStack_be < sVar52),
                                            -(ushort)(sStack_c0 < sVar52)))) |
                 CONCAT26(-(ushort)(sVar53 < sStack_1ea),
                          CONCAT24(-(ushort)(sVar53 < sStack_1ec),
                                   CONCAT22(-(ushort)(sVar53 < sStack_1ee),
                                            -(ushort)(sVar53 < sStack_1f0))));
        auVar49._8_8_ = uVar63;
        auVar49._0_8_ =
             CONCAT26(-(ushort)(sStack_c2 < sVar52),
                      CONCAT24(-(ushort)(sStack_c4 < sVar52),
                               CONCAT22(-(ushort)(sStack_c6 < sVar52),-(ushort)(local_c8 < sVar52)))
                     ) |
             CONCAT26(-(ushort)(sVar53 < sStack_1f2),
                      CONCAT24(-(ushort)(sVar53 < sStack_1f4),
                               CONCAT22(-(ushort)(sVar53 < sStack_1f6),-(ushort)(sVar53 < local_1f8)
                                       )));
        if ((((((((((((((((auVar49 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar49 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar49 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar49 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar49 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar49 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar63 >> 7 & 1) != 0) || (uVar63 >> 0xf & 1) != 0) || (uVar63 >> 0x17 & 1) != 0)
               || (uVar63 >> 0x1f & 1) != 0) || (uVar63 >> 0x27 & 1) != 0) ||
             (uVar63 >> 0x2f & 1) != 0) || (uVar63 >> 0x37 & 1) != 0) || (long)uVar63 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_dca = 0;
          local_dcc = 0;
          local_dce = 0;
          local_dd0 = 0;
          local_cd0 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_dca;
        *(int *)((long)&_segNum->s1 + 4) = local_cd0;
        _segNum->s1Len = matrix._4_4_;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->extra =
             (int)local_dcc;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->similar =
             (int)local_dce;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->length =
             (int)local_dd0;
        parasail_free(ptr_00);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLLoad);
        parasail_free(pvHLStore);
        parasail_free(pvHSLoad);
        parasail_free(pvHSStore);
        parasail_free(pvHMLoad);
        parasail_free(pvHMStore);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 2);
                vHM = _mm_slli_si128 (vHM, 2);
                vHS = _mm_slli_si128 (vHS, 2);
                vHL = _mm_slli_si128 (vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
            vHM = _mm_slli_si128 (vHM, 2);
            vHS = _mm_slli_si128 (vHS, 2);
            vHL = _mm_slli_si128 (vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}